

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O2

void __thiscall FloatInterval_Sqr_Test::TestBody(FloatInterval_Sqr_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  char *pcVar3;
  Interval<float> IVar4;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar5 [64];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar6 [64];
  AssertHelper local_60;
  AssertHelper local_58;
  FloatInterval b;
  AssertionResult gtest_ar;
  float local_38;
  float local_28;
  FloatInterval a;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  a.low = 1.75;
  a.high = 2.25;
  IVar4 = pbrt::Sqr<float>((Interval<float>)0x401000003fe00000);
  local_28 = IVar4.low;
  auVar5._0_8_ = pbrt::Interval<float>::operator*<float>(&a,(Interval<float>)0x401000003fe00000);
  auVar5._8_56_ = extraout_var;
  auVar1._8_8_ = extraout_XMM0_Qb;
  auVar1._0_4_ = IVar4.low;
  auVar1._4_4_ = IVar4.high;
  local_60.data_._0_4_ = (float)vextractps_avx(auVar5._0_16_,1);
  b.low = (float)vextractps_avx(auVar1,1);
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&gtest_ar,"as.UpperBound()","at.UpperBound()",&b.low,(float *)&local_60);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&b);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x308,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&b);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&b);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  b.low = local_28;
  local_38 = auVar5._0_4_;
  local_60.data_._0_4_ = local_38;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&gtest_ar,"as.LowerBound()","at.LowerBound()",&b.low,(float *)&local_60);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&b);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x309,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&b);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&b);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  b.low = -0.75;
  b.high = 1.25;
  IVar4 = pbrt::Sqr<float>((Interval<float>)0x3fa00000bf400000);
  local_28 = IVar4.low;
  auVar6._0_8_ = pbrt::Interval<float>::operator*<float>(&b,b);
  auVar6._8_56_ = extraout_var_00;
  auVar2._8_8_ = extraout_XMM0_Qb_00;
  auVar2._0_4_ = IVar4.low;
  auVar2._4_4_ = IVar4.high;
  local_58.data_._0_4_ = (float)vextractps_avx(auVar6._0_16_,1);
  local_60.data_._0_4_ = (float)vextractps_avx(auVar2,1);
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)&gtest_ar,"bs.UpperBound()","b2.UpperBound()",(float *)&local_60,
             (float *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x30e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_60.data_._0_4_ = 0.0;
  local_58.data_._0_4_ = local_28;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&gtest_ar,"0","bs.LowerBound()",(int *)&local_60,(float *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x30f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_38 = auVar6._0_4_;
  local_58.data_._0_4_ = 0.0;
  local_60.data_._0_4_ = local_38;
  testing::internal::CmpHelperLT<float,int>
            ((internal *)&gtest_ar,"b2.LowerBound()","0",(float *)&local_60,(int *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x310,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(FloatInterval, Sqr) {
    FloatInterval a = FloatInterval(1.75, 2.25);
    FloatInterval as = Sqr(a), at = a * a;
    EXPECT_EQ(as.UpperBound(), at.UpperBound());
    EXPECT_EQ(as.LowerBound(), at.LowerBound());

    // Straddle 0
    FloatInterval b = FloatInterval(-.75, 1.25);
    FloatInterval bs = Sqr(b), b2 = b * b;
    EXPECT_EQ(bs.UpperBound(), b2.UpperBound());
    EXPECT_EQ(0, bs.LowerBound());
    EXPECT_LT(b2.LowerBound(), 0);
}